

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O3

void __thiscall
flow_cutter::BasicCutter::
init<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::PseudoDepthFirstSearch>
          (BasicCutter *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph,TemporaryData *tmp,PseudoDepthFirstSearch *search_algo,SourceTargetPair p,
          int max_flow_intensity)

{
  pointer piVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  
  this->assimilated[0].node_set.node_count_inside_ = 0;
  lVar6 = (long)this->assimilated[0].node_set.inside_flag.data_.preimage_count_;
  if (lVar6 != 0) {
    memset(this->assimilated[0].node_set.inside_flag.data_.data_,0,lVar6 << 3);
  }
  piVar1 = this->assimilated[0].front.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->assimilated[0].front.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    this->assimilated[0].front.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  this->reachable[0].node_set.node_count_inside_ = 0;
  lVar6 = (long)this->reachable[0].node_set.inside_flag.data_.preimage_count_;
  if (lVar6 != 0) {
    memset(this->reachable[0].node_set.inside_flag.data_.data_,0,lVar6 << 3);
  }
  lVar6 = (long)this->assimilated[1].node_set.inside_flag.data_.preimage_count_;
  if (lVar6 != 0) {
    memset(this->assimilated[1].node_set.inside_flag.data_.data_,0,lVar6 << 3);
  }
  piVar1 = this->assimilated[1].front.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->assimilated[1].front.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    this->assimilated[1].front.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  lVar6 = (long)this->reachable[1].node_set.inside_flag.data_.preimage_count_;
  if (lVar6 != 0) {
    memset(this->reachable[1].node_set.inside_flag.data_.data_,0,lVar6 << 3);
  }
  lVar6 = (long)(this->flow).flow.data_.preimage_count_;
  if (lVar6 != 0) {
    memset((this->flow).flow.data_.data_,0x55,lVar6 << 3);
  }
  this->flow_intensity = 0;
  this->max_flow_intensity = max_flow_intensity;
  iVar9 = p.source;
  iVar5 = iVar9 + 0x3f;
  if (-1 < iVar9) {
    iVar5 = iVar9;
  }
  iVar5 = iVar5 >> 6;
  puVar2 = this->assimilated[0].node_set.inside_flag.data_.data_;
  uVar3 = puVar2[iVar5];
  puVar2[iVar5] = (ulong)(~(uint)(uVar3 >> ((ulong)p & 0x3f)) & 1) << ((ulong)p & 0x3f) ^ uVar3;
  this->assimilated[0].node_set.node_count_inside_ = 1;
  this->assimilated[0].node_set.extra_node = iVar9;
  puVar2 = this->reachable[0].node_set.inside_flag.data_.data_;
  uVar3 = puVar2[iVar5];
  puVar2[iVar5] = (ulong)(~(uint)(uVar3 >> ((ulong)p & 0x3f)) & 1) << ((ulong)p & 0x3f) ^ uVar3;
  this->reachable[0].node_set.node_count_inside_ = 1;
  this->reachable[0].node_set.extra_node = iVar9;
  uVar4 = p.target;
  uVar8 = uVar4 + 0x3f;
  if (-1 < (long)p) {
    uVar8 = uVar4;
  }
  uVar7 = (ulong)uVar4;
  iVar9 = (int)uVar8 >> 6;
  puVar2 = this->assimilated[1].node_set.inside_flag.data_.data_;
  uVar3 = puVar2[iVar9];
  puVar2[iVar9] = (ulong)(~(uint)(uVar3 >> (uVar7 & 0x3f)) & 1) << (uVar7 & 0x3f) ^ uVar3;
  this->assimilated[1].node_set.node_count_inside_ = 1;
  this->assimilated[1].node_set.extra_node = uVar4;
  puVar2 = this->reachable[1].node_set.inside_flag.data_.data_;
  uVar3 = puVar2[iVar9];
  puVar2[iVar9] = (ulong)(~(uint)(uVar3 >> (uVar7 & 0x3f)) & 1) << (uVar7 & 0x3f) ^ uVar3;
  this->reachable[1].node_set.node_count_inside_ = 1;
  this->reachable[1].node_set.extra_node = uVar4;
  grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::PseudoDepthFirstSearch>
            (this,graph,tmp,search_algo,0);
  grow_assimilated_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::PseudoDepthFirstSearch>
            (this,graph,tmp,search_algo);
  this->cut_available = true;
  return;
}

Assistant:

void init(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo, SourceTargetPair p,
        int max_flow_intensity
    )
    {
        assimilated[source_side].clear();
        reachable[source_side].clear();
        assimilated[target_side].clear();
        reachable[target_side].clear();
        flow.clear();

        flow_intensity = 0;
        this->max_flow_intensity = max_flow_intensity;

        assimilated[source_side].set_extra_node(graph, p.source);
        reachable[source_side].set_extra_node(graph, p.source);
        assimilated[target_side].set_extra_node(graph, p.target);
        reachable[target_side].set_extra_node(graph, p.target);

        grow_reachable_sets(graph, tmp, search_algo, source_side);
        grow_assimilated_sets(graph, tmp, search_algo);

        cut_available = true;
        check_invariants(graph);
    }